

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinematic_chain.c
# Opt level: O0

void rev_inertial_acceleration(kcc_joint *joint,gc_twist *xd,joint_velocity *qd,gc_acc_twist *xdd)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double v1m3;
  double v2m3;
  double w1m3;
  double w2m3;
  double v1m2;
  double v3m2;
  double w1m2;
  double w3m2;
  double v2m1;
  double v3m1;
  double w2m1;
  double w3m1;
  gc_acc_twist *xdd_local;
  joint_velocity *qd_local;
  gc_twist *xd_local;
  kcc_joint *joint_local;
  
  if (joint == (kcc_joint *)0x0) {
    __assert_fail("joint",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0xf8,
                  "void rev_inertial_acceleration(const struct kcc_joint *, const struct gc_twist *, const joint_velocity *, struct gc_acc_twist *)"
                 );
  }
  if (xd == (gc_twist *)0x0) {
    __assert_fail("xd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0xf9,
                  "void rev_inertial_acceleration(const struct kcc_joint *, const struct gc_twist *, const joint_velocity *, struct gc_acc_twist *)"
                 );
  }
  if (qd == (joint_velocity *)0x0) {
    __assert_fail("qd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0xfa,
                  "void rev_inertial_acceleration(const struct kcc_joint *, const struct gc_twist *, const joint_velocity *, struct gc_acc_twist *)"
                 );
  }
  if (xdd == (gc_acc_twist *)0x0) {
    __assert_fail("xdd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0xfb,
                  "void rev_inertial_acceleration(const struct kcc_joint *, const struct gc_twist *, const joint_velocity *, struct gc_acc_twist *)"
                 );
  }
  if (xd->angular_velocity == (vector3 *)0x0) {
    __assert_fail("xd->angular_velocity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0xfc,
                  "void rev_inertial_acceleration(const struct kcc_joint *, const struct gc_twist *, const joint_velocity *, struct gc_acc_twist *)"
                 );
  }
  if (xd->linear_velocity == (vector3 *)0x0) {
    __assert_fail("xd->linear_velocity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0xfd,
                  "void rev_inertial_acceleration(const struct kcc_joint *, const struct gc_twist *, const joint_velocity *, struct gc_acc_twist *)"
                 );
  }
  if (xdd->angular_acceleration == (vector3 *)0x0) {
    __assert_fail("xdd->angular_acceleration",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0xfe,
                  "void rev_inertial_acceleration(const struct kcc_joint *, const struct gc_twist *, const joint_velocity *, struct gc_acc_twist *)"
                 );
  }
  if (xdd->linear_acceleration == (vector3 *)0x0) {
    __assert_fail("xdd->linear_acceleration",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0xff,
                  "void rev_inertial_acceleration(const struct kcc_joint *, const struct gc_twist *, const joint_velocity *, struct gc_acc_twist *)"
                 );
  }
  if ((joint->field_1).revolute_joint.axis == JOINT_AXIS_X) {
    dVar1 = (xd->angular_velocity->field_0).field_0.z;
    dVar2 = *qd;
    dVar3 = (xd->angular_velocity->field_0).field_0.y;
    dVar4 = *qd;
    dVar5 = (xd->linear_velocity->field_0).field_0.z;
    dVar6 = *qd;
    dVar7 = (xd->linear_velocity->field_0).field_0.y;
    dVar8 = *qd;
    (xdd->angular_acceleration->field_0).field_0.x = 0.0;
    (xdd->angular_acceleration->field_0).field_0.y = dVar1 * dVar2;
    (xdd->angular_acceleration->field_0).field_0.z = -(dVar3 * dVar4);
    (xdd->linear_acceleration->field_0).field_0.x = 0.0;
    (xdd->linear_acceleration->field_0).field_0.y = dVar5 * dVar6;
    (xdd->linear_acceleration->field_0).field_0.z = -(dVar7 * dVar8);
  }
  else if ((joint->field_1).revolute_joint.axis == JOINT_AXIS_Y) {
    dVar1 = (xd->angular_velocity->field_0).field_0.x;
    dVar2 = *qd;
    dVar3 = (xd->linear_velocity->field_0).field_0.z;
    dVar4 = *qd;
    dVar5 = (xd->linear_velocity->field_0).field_0.x;
    dVar6 = *qd;
    (xdd->angular_acceleration->field_0).field_0.x =
         -((xd->angular_velocity->field_0).field_0.z * *qd);
    (xdd->angular_acceleration->field_0).field_0.y = 0.0;
    (xdd->angular_acceleration->field_0).field_0.z = dVar1 * dVar2;
    (xdd->linear_acceleration->field_0).field_0.x = -(dVar3 * dVar4);
    (xdd->linear_acceleration->field_0).field_0.y = 0.0;
    (xdd->linear_acceleration->field_0).field_0.z = dVar5 * dVar6;
  }
  else {
    if ((joint->field_1).revolute_joint.axis != JOINT_AXIS_Z) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                    ,0x129,
                    "void rev_inertial_acceleration(const struct kcc_joint *, const struct gc_twist *, const joint_velocity *, struct gc_acc_twist *)"
                   );
    }
    dVar1 = (xd->angular_velocity->field_0).field_0.x;
    dVar2 = *qd;
    dVar3 = (xd->linear_velocity->field_0).field_0.y;
    dVar4 = *qd;
    dVar5 = (xd->linear_velocity->field_0).field_0.x;
    dVar6 = *qd;
    (xdd->angular_acceleration->field_0).field_0.x = (xd->angular_velocity->field_0).field_0.y * *qd
    ;
    (xdd->angular_acceleration->field_0).field_0.y = -(dVar1 * dVar2);
    (xdd->angular_acceleration->field_0).field_0.z = 0.0;
    (xdd->linear_acceleration->field_0).field_0.x = dVar3 * dVar4;
    (xdd->linear_acceleration->field_0).field_0.y = -(dVar5 * dVar6);
    (xdd->linear_acceleration->field_0).field_0.z = 0.0;
  }
  return;
}

Assistant:

static void rev_inertial_acceleration(
        const struct kcc_joint *joint,
        const struct gc_twist *xd,
        const joint_velocity *qd,
        struct gc_acc_twist *xdd)
{
    assert(joint);
    assert(xd);
    assert(qd);
    assert(xdd);
    assert(xd->angular_velocity);
    assert(xd->linear_velocity);
    assert(xdd->angular_acceleration);
    assert(xdd->linear_acceleration);

    // Bias acceleration
    //       w_1 x w_2       -> e.g. w_1 x [0, 0, 1]
    // w_1 x v_2 + v_1 x w_2 -> e.g. w_1 x [0, 0, 0] + v_1 x [0, 0, 1] = v_1 x [0, 0, 1]
    if (joint->revolute_joint.axis == JOINT_AXIS_X) {
        double w3m1 = xd->angular_velocity->z * qd[0];
        double w2m1 = xd->angular_velocity->y * qd[0];
        double v3m1 = xd->linear_velocity->z * qd[0];
        double v2m1 = xd->linear_velocity->y * qd[0];

        xdd->angular_acceleration->x =  0.0;
        xdd->angular_acceleration->y =  w3m1;
        xdd->angular_acceleration->z = -w2m1;
        xdd->linear_acceleration->x =  0.0;
        xdd->linear_acceleration->y =  v3m1;
        xdd->linear_acceleration->z = -v2m1;
    } else if (joint->revolute_joint.axis == JOINT_AXIS_Y) {
        double w3m2 = xd->angular_velocity->z * qd[0];
        double w1m2 = xd->angular_velocity->x * qd[0];
        double v3m2 = xd->linear_velocity->z * qd[0];
        double v1m2 = xd->linear_velocity->x * qd[0];

        xdd->angular_acceleration->x = -w3m2;
        xdd->angular_acceleration->y =  0.0;
        xdd->angular_acceleration->z =  w1m2;
        xdd->linear_acceleration->x = -v3m2;
        xdd->linear_acceleration->y =  0.0;
        xdd->linear_acceleration->z =  v1m2;
    } else if (joint->revolute_joint.axis == JOINT_AXIS_Z) {
        double w2m3 = xd->angular_velocity->y * qd[0];
        double w1m3 = xd->angular_velocity->x * qd[0];
        double v2m3 = xd->linear_velocity->y * qd[0];
        double v1m3 = xd->linear_velocity->x * qd[0];

        xdd->angular_acceleration->x =  w2m3;
        xdd->angular_acceleration->y = -w1m3;
        xdd->angular_acceleration->z =  0.0;
        xdd->linear_acceleration->x =  v2m3;
        xdd->linear_acceleration->y = -v1m3;
        xdd->linear_acceleration->z =  0.0;
    } else {
        assert(0);
    }
}